

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void * __thiscall
pstd::pmr::monotonic_buffer_resource::do_allocate
          (monotonic_buffer_resource *this,size_t bytes,size_t align)

{
  size_t *psVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  void *pvVar6;
  ulong uVar7;
  undefined4 extraout_var_00;
  
  if (this->blockSize < bytes) {
    iVar3 = (*this->upstreamResource->_vptr_memory_resource[2])(this->upstreamResource,bytes,align);
    p_Var4 = (_List_node_base *)operator_new(0x20);
    p_Var4[1]._M_next = (_List_node_base *)CONCAT44(extraout_var,iVar3);
    p_Var4[1]._M_prev = (_List_node_base *)bytes;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(this->usedBlocks).
              super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var4 = (this->usedBlocks).
             super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  else {
    uVar7 = this->currentBlockPos % align;
    if (uVar7 != 0) {
      this->currentBlockPos = (this->currentBlockPos + align) - uVar7;
    }
    uVar7 = (this->currentBlock).size;
    if (uVar7 < this->currentBlockPos + bytes) {
      if (uVar7 != 0) {
        p_Var5 = (_List_node_base *)operator_new(0x20);
        p_Var4 = (_List_node_base *)(this->currentBlock).size;
        p_Var5[1]._M_next = (_List_node_base *)(this->currentBlock).ptr;
        p_Var5[1]._M_prev = p_Var4;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &(this->usedBlocks).
                  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        (this->currentBlock).ptr = (void *)0x0;
        (this->currentBlock).size = 0;
      }
      if (this->blockSize == 0) {
        pvVar6 = (void *)0x0;
      }
      else {
        iVar3 = (*this->upstreamResource->_vptr_memory_resource[2])
                          (this->upstreamResource,this->blockSize,0x10);
        pvVar6 = (void *)CONCAT44(extraout_var_00,iVar3);
      }
      sVar2 = this->blockSize;
      (this->currentBlock).ptr = pvVar6;
      (this->currentBlock).size = sVar2;
      this->currentBlockPos = 0;
    }
    p_Var4 = (_List_node_base *)((long)(this->currentBlock).ptr + this->currentBlockPos);
    this->currentBlockPos = bytes + this->currentBlockPos;
  }
  return p_Var4;
}

Assistant:

void *do_allocate(size_t bytes, size_t align) override {
        if (bytes > blockSize) {
            // We've got a big allocation; let the current block be so that
            // smaller allocations have a chance at using up more of it.
            usedBlocks.push_back(
                MemoryBlock{upstreamResource->allocate(bytes, align), bytes});
            return usedBlocks.back().ptr;
        }

        if ((currentBlockPos % align) != 0)
            currentBlockPos += align - (currentBlockPos % align);
        DCHECK_EQ(0, currentBlockPos % align);

        if (currentBlockPos + bytes > currentBlock.size) {
            // Add current block to _usedBlocks_ list
            if (currentBlock.size) {
                usedBlocks.push_back(currentBlock);
                currentBlock = {};
            }

            currentBlock = {
                upstreamResource->allocate(blockSize, alignof(std::max_align_t)),
                blockSize};
            currentBlockPos = 0;
        }

        void *ptr = (char *)currentBlock.ptr + currentBlockPos;
        currentBlockPos += bytes;
        return ptr;
    }